

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FArchive *arc,SDWORD *vars,int max)

{
  long lVar1;
  long lVar2;
  DWORD DVar3;
  ulong uVar4;
  DWORD *w;
  int iVar5;
  int iVar6;
  SDWORD arcval;
  DWORD local_3c;
  DWORD local_38;
  DWORD local_34;
  
  if (arc->m_Storing == true) {
    if (max < 1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (vars[uVar4] != 0) goto LAB_005028ea;
        uVar4 = uVar4 + 1;
      } while ((uint)max != uVar4);
      uVar4 = (ulong)(uint)max;
    }
LAB_005028ea:
    lVar2 = (long)max;
    DVar3 = (DWORD)uVar4;
    iVar6 = max + 1;
    do {
      iVar5 = iVar6;
      if (lVar2 <= (int)DVar3) goto LAB_0050295c;
      iVar6 = iVar5 + -1;
      lVar1 = lVar2 + -1;
      lVar2 = lVar2 + -1;
    } while (vars[lVar1] == 0);
    if ((int)DVar3 < iVar6) {
      iVar5 = iVar5 + -2;
      local_34 = iVar6 - DVar3;
      FArchive::operator<<(arc,&local_34);
      local_34 = DVar3;
      FArchive::operator<<(arc,&local_34);
      if ((int)DVar3 <= iVar5) {
        iVar6 = DVar3 - 1;
        w = (DWORD *)(vars + (int)DVar3);
        do {
          FArchive::operator<<(arc,w);
          iVar6 = iVar6 + 1;
          w = w + 1;
        } while (iVar6 < iVar5);
      }
    }
    else {
LAB_0050295c:
      local_34 = 0;
      FArchive::operator<<(arc,&local_34);
    }
  }
  else {
    memset(vars,0,(long)max << 2);
    FArchive::operator<<(arc,&local_38);
    if (local_38 != 0) {
      FArchive::operator<<(arc,&local_3c);
      DVar3 = local_38 + local_3c;
      local_38 = max;
      if ((int)DVar3 < max) {
        local_38 = DVar3;
      }
      if ((int)local_3c < (int)local_38) {
        do {
          FArchive::operator<<(arc,(DWORD *)(vars + (int)local_3c));
          local_3c = local_3c + 1;
        } while ((int)local_3c < (int)local_38);
      }
      if ((int)local_3c < (int)DVar3) {
        do {
          FArchive::operator<<(arc,&local_34);
          local_3c = local_3c + 1;
        } while ((int)local_3c < (int)DVar3);
      }
    }
  }
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FArchive &arc, SDWORD *vars, int max)
{
	SDWORD arcval;
	SDWORD first, last;

	if (arc.IsStoring ())
	{
		// Find first non-zero variable
		for (first = 0; first < max; ++first)
		{
			if (vars[first] != 0)
			{
				break;
			}
		}

		// Find last non-zero variable
		for (last = max - 1; last >= first; --last)
		{
			if (vars[last] != 0)
			{
				break;
			}
		}

		if (last < first)
		{ // no non-zero variables
			arcval = 0;
			arc << arcval;
			return;
		}

		arcval = last - first + 1;
		arc << arcval;
		arcval = first;
		arc << arcval;

		while (first <= last)
		{
			arc << vars[first];
			++first;
		}
	}
	else
	{
		SDWORD truelast;

		memset (vars, 0, max*sizeof(*vars));

		arc << last;
		if (last == 0)
		{
			return;
		}
		arc << first;
		last += first;
		truelast = last;

		if (last > max)
		{
			last = max;
		}

		while (first < last)
		{
			arc << vars[first];
			++first;
		}
		while (first < truelast)
		{
			arc << arcval;
			++first;
		}
	}
}